

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::LSTM_x86_avx::forward
          (LSTM_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  pointer pMVar8;
  void *pvVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar13;
  void *__src;
  bool bVar14;
  Mat m;
  Mat local_378;
  Mat local_328;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2e0;
  Mat m_3;
  Mat m_7;
  Mat m_2;
  Mat m_1;
  Mat m_6;
  Mat m_5;
  Mat m_4;
  Mat m_11;
  Mat m_10;
  
  if ((this->super_LSTM).int8_scale_term != 0) {
    iVar2 = forward_int8(this,bottom_blobs,top_blobs,opt);
    return iVar2;
  }
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar2 = (this->super_LSTM).direction;
  local_328.cstep = 0;
  local_328.data = (void *)0x0;
  local_328.refcount._0_4_ = 0;
  local_328.refcount._4_4_ = 0;
  local_328.elemsize._0_4_ = 0;
  local_328.elemsize._4_4_ = 0;
  local_328.elempack = 0;
  local_328.allocator = (Allocator *)0x0;
  local_328.dims = 0;
  local_328.w = 0;
  local_328.h = 0;
  local_328.d = 0;
  local_328.c = 0;
  local_378.cstep = 0;
  local_378.data = (void *)0x0;
  local_378.refcount._0_4_ = 0;
  local_378.refcount._4_4_ = 0;
  local_378.elemsize._0_4_ = 0;
  local_378.elemsize._4_4_ = 0;
  local_378.elempack = 0;
  local_378.allocator = (Allocator *)0x0;
  local_378.dims = 0;
  local_378.w = 0;
  local_378.h = 0;
  local_378.d = 0;
  local_378.c = 0;
  pvVar9 = (void *)((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start);
  _allocator = (&opt->blob_allocator)[pvVar9 != (void *)0xd8];
  iVar3 = -100;
  local_2e0 = top_blobs;
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,0xd8,pvVar9);
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_328.allocator == (Allocator *)0x0) {
          free(local_328.data);
        }
        else {
          (*(local_328.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_328.data = m.data;
    local_328.refcount._0_4_ = m.refcount._0_4_;
    local_328.refcount._4_4_ = m.refcount._4_4_;
    local_328.elemsize._0_4_ = (undefined4)m.elemsize;
    local_328.elemsize._4_4_ = m.elemsize._4_4_;
    local_328.elempack = m.elempack;
    local_328.allocator = m.allocator;
    local_328.dims = m.dims;
    local_328.w = m.w;
    local_328.h = m.h;
    local_328.d = m.d;
    local_328.c = m.c;
    local_328.cstep = m.cstep;
    sVar6 = m.cstep;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    Mat::clone(&m,(__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar6,
               pvVar9);
    pvVar13 = local_2e0;
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_378.allocator == (Allocator *)0x0) {
          free(local_378.data);
        }
        else {
          (*(local_378.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_378.data = m.data;
    local_378.refcount._0_4_ = m.refcount._0_4_;
    local_378.refcount._4_4_ = m.refcount._4_4_;
    local_378.elemsize._0_4_ = (undefined4)m.elemsize;
    local_378.elemsize._4_4_ = m.elemsize._4_4_;
    local_378.elempack = m.elempack;
    local_378.allocator = m.allocator;
    local_378.dims = m.dims;
    local_378.w = m.w;
    local_378.h = m.h;
    local_378.d = m.d;
    local_378.c = m.c;
    local_378.cstep = m.cstep;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    iVar10 = (iVar2 == 2) + 1;
    Mat::create(&local_328,(this->super_LSTM).num_output,iVar10,4,_allocator);
    if ((local_328.data == (void *)0x0) || (local_328.cstep * (long)local_328.c == 0))
    goto LAB_00348d5b;
    uVar4 = (int)local_328.cstep * local_328.c;
    uVar11 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar11;
    }
    for (; (int)uVar5 != (int)uVar11; uVar11 = uVar11 + 1) {
      *(undefined4 *)((long)local_328.data + uVar11 * 4) = 0;
    }
    Mat::create(&local_378,(this->super_LSTM).hidden_size,iVar10,4,_allocator);
    if ((local_378.data == (void *)0x0) || (local_378.cstep * (long)local_378.c == 0))
    goto LAB_00348d5b;
    iVar10 = (int)local_378.cstep * local_378.c;
    lVar7 = 0;
    if (iVar10 < 1) {
      iVar10 = 0;
    }
    for (; pvVar13 = local_2e0, iVar10 != (int)lVar7; lVar7 = lVar7 + 1) {
      *(undefined4 *)((long)local_378.data + lVar7 * 4) = 0;
    }
  }
  this_00 = (pvVar13->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,(this->super_LSTM).num_output << (iVar2 == 2),_h,4,opt->blob_allocator);
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    uVar4 = (this->super_LSTM).direction;
    if (uVar4 < 2) {
      m.w = (this->weight_xc_data_packed).w;
      m.h = (this->weight_xc_data_packed).h;
      m.c = (this->weight_xc_data_packed).d;
      m.data = (this->weight_xc_data_packed).data;
      uVar5 = (this->weight_xc_data_packed).elemsize;
      m.elempack = (this->weight_xc_data_packed).elempack;
      m.allocator = (this->weight_xc_data_packed).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar5;
      m.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
      m.d = 1;
      iVar2 = (this->weight_xc_data_packed).dims;
      m.dims = iVar2 + -1;
      m.cstep = (uVar5 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar5;
      if (iVar2 == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = (this->bias_c_data_packed).w;
      m_1.h = (this->bias_c_data_packed).h;
      m_1.data = (this->bias_c_data_packed).data;
      uVar5 = (this->bias_c_data_packed).elemsize;
      m_1.elempack = (this->bias_c_data_packed).elempack;
      m_1.allocator = (this->bias_c_data_packed).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar5;
      m_1.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
      m_1.c = (this->bias_c_data_packed).d;
      m_1.d = 1;
      iVar2 = (this->bias_c_data_packed).dims;
      m_1.dims = iVar2 + -1;
      m_1.cstep = (uVar5 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar5;
      if (iVar2 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->weight_hc_data_packed).w;
      m_2.h = (this->weight_hc_data_packed).h;
      m_2.c = (this->weight_hc_data_packed).d;
      m_2.data = (this->weight_hc_data_packed).data;
      m_2.elemsize = (this->weight_hc_data_packed).elemsize;
      m_2.elempack = (this->weight_hc_data_packed).elempack;
      m_2.allocator = (this->weight_hc_data_packed).allocator;
      m_2.refcount = (int *)0x0;
      m_2.d = 1;
      sVar6 = (long)m_2.h * (long)m_2.w;
      iVar2 = (this->weight_hc_data_packed).dims;
      m_2.dims = iVar2 + -1;
      m_2.cstep = (m_2.elemsize * sVar6 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
      if (iVar2 == 4) {
        m_2.cstep = sVar6;
      }
      if ((this->super_LSTM).num_output == (this->super_LSTM).hidden_size) {
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.allocator = (Allocator *)0x0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
      }
      else {
        m_3.w = (this->super_LSTM).weight_hr_data.w;
        m_3.h = (this->super_LSTM).weight_hr_data.h;
        m_3.c = (this->super_LSTM).weight_hr_data.d;
        m_3.data = (this->super_LSTM).weight_hr_data.data;
        uVar5 = (this->super_LSTM).weight_hr_data.elemsize;
        m_3.elempack = (this->super_LSTM).weight_hr_data.elempack;
        m_3.allocator = (this->super_LSTM).weight_hr_data.allocator;
        m_3.elemsize._0_4_ = (undefined4)uVar5;
        m_3.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
        m_3.d = 1;
        iVar2 = (this->super_LSTM).weight_hr_data.dims;
        m_3.dims = iVar2 + -1;
        m_3.cstep = (uVar5 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar5;
        if (iVar2 == 4) {
          m_3.cstep = (long)m_3.h * (long)m_3.w;
        }
      }
      m_3.refcount._4_4_ = 0;
      m_3.refcount._0_4_ = 0;
      iVar3 = lstm(bottom_blob,this_00,uVar4,&m,&m_1,&m_2,&m_3,&local_328,&local_378,opt);
      if (iVar3 != 0) goto LAB_00348d5b;
      uVar4 = (this->super_LSTM).direction;
    }
    if (uVar4 == 2) {
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      Mat::create(&m,(this->super_LSTM).num_output,_h,4,opt->workspace_allocator);
      iVar3 = -100;
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
        bVar14 = false;
      }
      else {
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.allocator = (Allocator *)0x0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        Mat::create(&m_1,(this->super_LSTM).num_output,_h,4,opt->workspace_allocator);
        iVar3 = -100;
        if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
          bVar14 = false;
        }
        else {
          m_2.cstep = (size_t)local_328.w;
          m_2.elemsize = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
          m_2.data = local_328.data;
          m_2.refcount = (int *)0x0;
          m_2.elempack = local_328.elempack;
          m_2.allocator = local_328.allocator;
          iVar12 = 2;
          m_2.w = local_328.w;
          m_2.h = 1;
          m_2.d = 1;
          iVar10 = 1;
          m_3.cstep = (size_t)local_378.w;
          m_3.data = local_378.data;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = (undefined4)local_378.elemsize;
          m_3.elemsize._4_4_ = local_378.elemsize._4_4_;
          m_3.elempack = local_378.elempack;
          m_3.allocator = local_378.allocator;
          m_3.w = local_378.w;
          m_3.h = 1;
          m_3.d = 1;
          m_4.w = (this->weight_xc_data_packed).w;
          m_4.h = (this->weight_xc_data_packed).h;
          m_4.c = (this->weight_xc_data_packed).d;
          m_4.data = (this->weight_xc_data_packed).data;
          m_4.elemsize = (this->weight_xc_data_packed).elemsize;
          m_4.elempack = (this->weight_xc_data_packed).elempack;
          m_4.allocator = (this->weight_xc_data_packed).allocator;
          m_4.refcount = (int *)0x0;
          m_4.d = 1;
          sVar6 = (long)m_4.h * (long)m_4.w;
          iVar2 = (this->weight_xc_data_packed).dims;
          m_4.dims = iVar2 + -1;
          m_4.cstep = (m_4.elemsize * sVar6 + 0xf & 0xfffffffffffffff0) / m_4.elemsize;
          if (iVar2 == 4) {
            m_4.cstep = sVar6;
          }
          m_5.w = (this->bias_c_data_packed).w;
          m_5.h = (this->bias_c_data_packed).h;
          m_5.c = (this->bias_c_data_packed).d;
          m_5.data = (this->bias_c_data_packed).data;
          m_5.elemsize = (this->bias_c_data_packed).elemsize;
          m_5.elempack = (this->bias_c_data_packed).elempack;
          m_5.allocator = (this->bias_c_data_packed).allocator;
          m_5.refcount = (int *)0x0;
          m_5.d = 1;
          sVar6 = (long)m_5.h * (long)m_5.w;
          iVar2 = (this->bias_c_data_packed).dims;
          m_5.dims = iVar2 + -1;
          m_5.cstep = (m_5.elemsize * sVar6 + 0xf & 0xfffffffffffffff0) / m_5.elemsize;
          if (iVar2 == 4) {
            m_5.cstep = sVar6;
          }
          m_6.w = (this->weight_hc_data_packed).w;
          m_6.h = (this->weight_hc_data_packed).h;
          m_6.c = (this->weight_hc_data_packed).d;
          m_6.data = (this->weight_hc_data_packed).data;
          m_6.elemsize = (this->weight_hc_data_packed).elemsize;
          m_6.elempack = (this->weight_hc_data_packed).elempack;
          m_6.allocator = (this->weight_hc_data_packed).allocator;
          m_6.refcount = (int *)0x0;
          m_6.d = 1;
          iVar2 = (this->weight_hc_data_packed).dims;
          m_6.dims = iVar2 + -1;
          m_6.cstep = (m_6.elemsize * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) /
                      m_6.elemsize;
          if (iVar2 == 4) {
            m_6.cstep = (long)m_6.h * (long)m_6.w;
          }
          if ((this->super_LSTM).num_output == (this->super_LSTM).hidden_size) {
            m_7.cstep = 0;
            m_7.data = (void *)0x0;
            m_7.elemsize._0_4_ = 0;
            m_7.elemsize._4_4_ = 0;
            m_7.elempack = 0;
            m_7.allocator = (Allocator *)0x0;
            m_7.dims = 0;
            m_7.w = 0;
            m_7.h = 0;
            m_7.d = 0;
            m_7.c = 0;
          }
          else {
            m_7.w = (this->super_LSTM).weight_hr_data.w;
            m_7.h = (this->super_LSTM).weight_hr_data.h;
            m_7.data = (this->super_LSTM).weight_hr_data.data;
            uVar5 = (this->super_LSTM).weight_hr_data.elemsize;
            m_7.elempack = (this->super_LSTM).weight_hr_data.elempack;
            m_7.allocator = (this->super_LSTM).weight_hr_data.allocator;
            m_7.elemsize._0_4_ = (undefined4)uVar5;
            m_7.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
            m_7.c = (this->super_LSTM).weight_hr_data.d;
            m_7.d = 1;
            iVar2 = (this->super_LSTM).weight_hr_data.dims;
            m_7.dims = iVar2 + -1;
            m_7.cstep = (uVar5 * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) / uVar5;
            if (iVar2 == 4) {
              m_7.cstep = (long)m_7.h * (long)m_7.w;
            }
          }
          m_7.refcount._4_4_ = 0;
          m_7.refcount._0_4_ = 0;
          m_3.dims = iVar12;
          m_3.c = iVar10;
          m_2.dims = iVar12;
          m_2.c = iVar10;
          iVar3 = lstm(bottom_blob,&m,0,&m_4,&m_5,&m_6,&m_7,&m_2,&m_3,opt);
          if (iVar3 == 0) {
            m_4.cstep = (size_t)local_328.w;
            m_4.elemsize = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
            m_4.data = (void *)(m_4.elemsize * m_4.cstep + (long)local_328.data);
            m_4.refcount = (int *)0x0;
            m_4.elempack = local_328.elempack;
            m_4.allocator = local_328.allocator;
            m_4.w = local_328.w;
            m_4.h = 1;
            m_4.d = 1;
            m_5.cstep = (size_t)local_378.w;
            m_5.elemsize = CONCAT44(local_378.elemsize._4_4_,(undefined4)local_378.elemsize);
            m_5.data = (void *)(m_5.elemsize * m_5.cstep + (long)local_378.data);
            m_5.refcount = (int *)0x0;
            m_5.elempack = local_378.elempack;
            m_5.allocator = local_378.allocator;
            m_5.w = local_378.w;
            m_5.h = 1;
            m_5.d = 1;
            m_6.w = (this->weight_xc_data_packed).w;
            m_6.h = (this->weight_xc_data_packed).h;
            m_6.elemsize = (this->weight_xc_data_packed).elemsize;
            m_6.data = (void *)((this->weight_xc_data_packed).cstep * m_6.elemsize +
                               (long)(this->weight_xc_data_packed).data);
            m_6.c = (this->weight_xc_data_packed).d;
            m_6.elempack = (this->weight_xc_data_packed).elempack;
            m_6.allocator = (this->weight_xc_data_packed).allocator;
            m_6.refcount = (int *)0x0;
            iVar2 = (this->weight_xc_data_packed).dims;
            m_6.dims = iVar2 + -1;
            m_6.cstep = (m_6.elemsize * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) /
                        m_6.elemsize;
            if (iVar2 == 4) {
              m_6.cstep = (long)m_6.h * (long)m_6.w;
            }
            m_7.w = (this->bias_c_data_packed).w;
            m_7.h = (this->bias_c_data_packed).h;
            uVar5 = (this->bias_c_data_packed).elemsize;
            m_7.data = (void *)((this->bias_c_data_packed).cstep * uVar5 +
                               (long)(this->bias_c_data_packed).data);
            m_7.elempack = (this->bias_c_data_packed).elempack;
            m_7.allocator = (this->bias_c_data_packed).allocator;
            m_7.refcount._0_4_ = 0;
            m_7.refcount._4_4_ = 0;
            m_7.elemsize._0_4_ = (undefined4)uVar5;
            m_7.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
            m_7.c = (this->bias_c_data_packed).d;
            m_7.d = 1;
            iVar2 = (this->bias_c_data_packed).dims;
            m_7.dims = iVar2 + -1;
            m_7.cstep = (uVar5 * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) / uVar5;
            if (iVar2 == 4) {
              m_7.cstep = (long)m_7.h * (long)m_7.w;
            }
            m_10.w = (this->weight_hc_data_packed).w;
            m_10.h = (this->weight_hc_data_packed).h;
            m_10.elemsize = (this->weight_hc_data_packed).elemsize;
            m_10.data = (void *)((this->weight_hc_data_packed).cstep * m_10.elemsize +
                                (long)(this->weight_hc_data_packed).data);
            m_10.c = (this->weight_hc_data_packed).d;
            m_10.elempack = (this->weight_hc_data_packed).elempack;
            m_10.allocator = (this->weight_hc_data_packed).allocator;
            m_10.refcount = (int *)0x0;
            m_10.d = 1;
            iVar2 = (this->weight_hc_data_packed).dims;
            m_10.dims = iVar2 + -1;
            m_10.cstep = (m_10.elemsize * (long)m_10.h * (long)m_10.w + 0xf & 0xfffffffffffffff0) /
                         m_10.elemsize;
            if (iVar2 == 4) {
              m_10.cstep = (long)m_10.h * (long)m_10.w;
            }
            if ((this->super_LSTM).num_output == (this->super_LSTM).hidden_size) {
              m_11.cstep = 0;
              m_11.data = (void *)0x0;
              m_11.elemsize._0_4_ = 0;
              m_11.elemsize._4_4_ = 0;
              m_11.elempack = 0;
              m_11.allocator = (Allocator *)0x0;
              m_11.dims = 0;
              m_11.w = 0;
              m_11.h = 0;
              m_11.d = 0;
              m_11.c = 0;
            }
            else {
              m_11.w = (this->super_LSTM).weight_hr_data.w;
              m_11.h = (this->super_LSTM).weight_hr_data.h;
              uVar5 = (this->super_LSTM).weight_hr_data.elemsize;
              m_11.data = (void *)((this->super_LSTM).weight_hr_data.cstep * uVar5 +
                                  (long)(this->super_LSTM).weight_hr_data.data);
              m_11.elempack = (this->super_LSTM).weight_hr_data.elempack;
              m_11.allocator = (this->super_LSTM).weight_hr_data.allocator;
              m_11.elemsize._0_4_ = (undefined4)uVar5;
              m_11.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
              m_11.c = (this->super_LSTM).weight_hr_data.d;
              m_11.d = 1;
              iVar2 = (this->super_LSTM).weight_hr_data.dims;
              m_11.dims = iVar2 + -1;
              m_11.cstep = (uVar5 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) / uVar5;
              if (iVar2 == 4) {
                m_11.cstep = (long)m_11.h * (long)m_11.w;
              }
            }
            m_11.refcount._4_4_ = 0;
            m_11.refcount._0_4_ = 0;
            m_6.d = iVar10;
            m_5.dims = iVar12;
            m_5.c = iVar10;
            m_4.dims = iVar12;
            m_4.c = iVar10;
            iVar3 = lstm(bottom_blob,&m_1,1,&m_6,&m_7,&m_10,&m_11,&m_4,&m_5,opt);
            bVar14 = iVar3 == 0;
            if (bVar14) {
              uVar11 = 0;
              uVar5 = (ulong)_h;
              if ((int)_h < 1) {
                uVar5 = uVar11;
              }
              for (; uVar5 != uVar11; uVar11 = uVar11 + 1) {
                __src = (void *)((long)m_1.w * uVar11 *
                                 CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                (long)m_1.data);
                pvVar9 = (void *)((long)this_00->w * uVar11 * this_00->elemsize +
                                 (long)this_00->data);
                memcpy(pvVar9,(void *)((long)m.w * uVar11 *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                      (long)m.data),(long)(this->super_LSTM).num_output << 2);
                lVar7 = (long)(this->super_LSTM).num_output;
                memcpy((void *)((long)pvVar9 + lVar7 * 4),__src,lVar7 << 2);
              }
            }
            piVar1 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  free(m_3.data);
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            bVar14 = false;
          }
          if (m_2.refcount != (int *)0x0) {
            LOCK();
            *m_2.refcount = *m_2.refcount + -1;
            UNLOCK();
            if (*m_2.refcount == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                free(m_2.data);
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar1 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            free(m.data);
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar14) goto LAB_00348d5b;
    }
    pMVar8 = (local_2e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = 0;
    if ((long)(local_2e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar8 == 0xd8) {
      if (pMVar8 + 1 != &local_328) {
        piVar1 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = pMVar8[1].refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (pMVar8[1].allocator == (Allocator *)0x0) {
              free(pMVar8[1].data);
            }
            else {
              (*(pMVar8[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar8[1].data = local_328.data;
        pMVar8[1].refcount = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
        pMVar8[1].elemsize = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
        pMVar8[1].elempack = local_328.elempack;
        pMVar8[1].allocator = local_328.allocator;
        pMVar8[1].dims = local_328.dims;
        pMVar8[1].w = local_328.w;
        pMVar8[1].h = local_328.h;
        pMVar8[1].d = local_328.d;
        pMVar8[1].c = local_328.c;
        pMVar8[1].cstep = local_328.cstep;
        pMVar8 = (local_2e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      iVar3 = 0;
      if (pMVar8 + 2 != &local_378) {
        piVar1 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = pMVar8[2].refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (pMVar8[2].allocator == (Allocator *)0x0) {
              free(pMVar8[2].data);
            }
            else {
              (*(pMVar8[2].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar8[2].data = local_378.data;
        pMVar8[2].refcount = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
        pMVar8[2].elemsize = CONCAT44(local_378.elemsize._4_4_,(undefined4)local_378.elemsize);
        pMVar8[2].elempack = local_378.elempack;
        pMVar8[2].allocator = local_378.allocator;
        pMVar8[2].dims = local_378.dims;
        pMVar8[2].w = local_378.w;
        pMVar8[2].h = local_378.h;
        pMVar8[2].d = local_378.d;
        pMVar8[2].c = local_378.c;
        pMVar8[2].cstep = local_378.cstep;
      }
    }
  }
LAB_00348d5b:
  piVar1 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_378.allocator == (Allocator *)0x0) {
        free(local_378.data);
      }
      else {
        (*(local_378.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar1 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_328.allocator == (Allocator *)0x0) {
        free(local_328.data);
      }
      else {
        (*(local_328.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar3;
}

Assistant:

int LSTM_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif

    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(hidden_size, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data_packed.channel(0), bias_c_data_packed.channel(0), weight_hc_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        {
            int ret = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data_packed.channel(0), bias_c_data_packed.channel(0), weight_hc_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden0, cell0, opt);
            if (ret != 0)
                return ret;
        }

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        {
            int ret = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data_packed.channel(1), bias_c_data_packed.channel(1), weight_hc_data_packed.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden1, cell1, opt);
            if (ret != 0)
                return ret;
        }

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}